

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O0

uint Assimp::strtoul10(char *in,char **out)

{
  undefined4 local_1c;
  uint value;
  char **out_local;
  char *in_local;
  
  local_1c = 0;
  for (out_local = (char **)in; ('/' < *(char *)out_local && (*(char *)out_local < ':'));
      out_local = (char **)((long)out_local + 1)) {
    local_1c = local_1c * 10 + *(char *)out_local + -0x30;
  }
  if (out != (char **)0x0) {
    *out = (char *)out_local;
  }
  return local_1c;
}

Assistant:

inline
unsigned int strtoul10( const char* in, const char** out=0) {
    unsigned int value = 0;

    for ( ;; ) {
        if ( *in < '0' || *in > '9' ) {
            break;
        }

        value = ( value * 10 ) + ( *in - '0' );
        ++in;
    }
    if ( out ) {
        *out = in;
    }
    return value;
}